

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

int __thiscall
zmq::options_t::setsockopt
          (options_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  pointer *pptVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  iterator __position;
  pointer ptVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  size_t sVar11;
  undefined4 in_register_00000014;
  uint64_t *__first;
  string *psVar12;
  char *pcVar13;
  bool *out_value_;
  ipc_uid_accept_filters_t *set_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar14;
  ulong uVar15;
  undefined8 uVar16;
  tcp_address_mask_t mask;
  string filter_str;
  string key;
  string val;
  ip_addr_t local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __first = (uint64_t *)CONCAT44(in_register_00000014,__level);
  uVar15 = CONCAT44(in_register_0000000c,__optname);
  sVar11 = 0;
  if (uVar15 == 4) {
    sVar11 = (size_t)(uint)*__first;
  }
  uVar10 = (uint)sVar11;
  switch(__fd) {
  case 4:
    if (uVar15 == 8) {
      this->affinity = *__first;
      return 0;
    }
    break;
  case 5:
    if (uVar15 - 1 < 0xff) {
      this->routing_id_size = (uchar)__optname;
      memcpy(this->routing_id,__first,uVar15);
      return 0;
    }
    break;
  case 8:
    if (0 < (int)uVar10 && uVar15 == 4) {
      this->rate = uVar10;
      return 0;
    }
    break;
  case 9:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->recovery_ivl = uVar10;
      return 0;
    }
    break;
  case 0xb:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->sndbuf = uVar10;
      return 0;
    }
    break;
  case 0xc:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->rcvbuf = uVar10;
      return 0;
    }
    break;
  case 0x11:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      (this->linger)._value.super___atomic_base<int>._M_i = uVar10;
      return 0;
    }
    break;
  case 0x12:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->reconnect_ivl = uVar10;
      return 0;
    }
    break;
  case 0x13:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->backlog = uVar10;
      return 0;
    }
    break;
  case 0x15:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->reconnect_ivl_max = uVar10;
      return 0;
    }
    break;
  case 0x16:
    if (uVar15 == 8) {
      this->maxmsgsize = *__first;
      return 0;
    }
    break;
  case 0x17:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->sndhwm = uVar10;
      return 0;
    }
    break;
  case 0x18:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->rcvhwm = uVar10;
      return 0;
    }
    break;
  case 0x19:
    if (0 < (int)uVar10 && uVar15 == 4) {
      this->multicast_hops = uVar10;
      return 0;
    }
    break;
  case 0x1b:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->rcvtimeo = uVar10;
      return 0;
    }
    break;
  case 0x1c:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->sndtimeo = uVar10;
      return 0;
    }
    break;
  case 0x1f:
    iVar5 = do_setsockopt_int_as_bool_strict(__first,uVar15,(bool *)&local_98);
    if (iVar5 == 0) {
      this->ipv6 = (bool)((byte)local_98.first._M_dataplus._M_p ^ 1);
      return 0;
    }
    return iVar5;
  case 0x22:
    if (uVar10 + 1 < 3 && uVar15 == 4) {
      this->tcp_keepalive = uVar10;
      return 0;
    }
    break;
  case 0x23:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->tcp_keepalive_cnt = uVar10;
      return 0;
    }
    break;
  case 0x24:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->tcp_keepalive_idle = uVar10;
      return 0;
    }
    break;
  case 0x25:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->tcp_keepalive_intvl = uVar10;
      return 0;
    }
    break;
  case 0x26:
    paVar2 = &local_98.first.field_2;
    local_98.first._M_string_length = 0;
    local_98.first.field_2._M_allocated_capacity =
         local_98.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_98.first._M_dataplus._M_p = (pointer)paVar2;
    iVar5 = do_setsockopt_string_allow_empty_strict(__first,uVar15,&local_98.first,0xff);
    iVar6 = -1;
    if (iVar5 == 0) {
      if (local_98.first._M_string_length == 0) {
        ptVar4 = (this->tcp_accept_filters).
                 super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = 0;
        if ((this->tcp_accept_filters).
            super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>.
            _M_impl.super__Vector_impl_data._M_finish != ptVar4) {
          (this->tcp_accept_filters).
          super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>.
          _M_impl.super__Vector_impl_data._M_finish = ptVar4;
        }
      }
      else {
        tcp_address_mask_t::tcp_address_mask_t((tcp_address_mask_t *)&local_b8);
        iVar6 = tcp_address_mask_t::resolve
                          ((tcp_address_mask_t *)&local_b8,local_98.first._M_dataplus._M_p,
                           this->ipv6);
        if (iVar6 == 0) {
          __position._M_current =
               (this->tcp_accept_filters).
               super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->tcp_accept_filters).
              super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<zmq::tcp_address_mask_t,std::allocator<zmq::tcp_address_mask_t>>::
            _M_realloc_insert<zmq::tcp_address_mask_t_const&>
                      ((vector<zmq::tcp_address_mask_t,std::allocator<zmq::tcp_address_mask_t>> *)
                       &this->tcp_accept_filters,__position,(tcp_address_mask_t *)&local_b8);
          }
          else {
            *(undefined8 *)((long)&(__position._M_current)->_network_address + 0x10) =
                 local_b8._16_8_;
            *(undefined8 *)((long)&(__position._M_current)->_network_address + 0x18) =
                 stack0xffffffffffffff60;
            *(undefined8 *)&(__position._M_current)->_network_address = local_b8._0_8_;
            *(uchar (*) [8])((long)&(__position._M_current)->_network_address + 8) =
                 local_b8.ipv4.sin_zero;
            pptVar1 = &(this->tcp_accept_filters).
                       super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_98.first._M_dataplus._M_p,
                      local_98.first.field_2._M_allocated_capacity + 1);
      return iVar6;
    }
    return iVar6;
  case 0x27:
    if (uVar10 < 2 && uVar15 == 4) {
      this->immediate = uVar10;
      return 0;
    }
    break;
  case 0x2a:
    out_value_ = &this->ipv6;
    goto LAB_0017ce43;
  case 0x2c:
    if (uVar10 < 2 && uVar15 == 4) {
      this->as_server = uVar10;
      this->mechanism = uVar10;
      return 0;
    }
    break;
  case 0x2d:
    if (__first == (uint64_t *)0x0 && uVar15 == 0) {
LAB_0017ce69:
      this->mechanism = 0;
      return 0;
    }
    if (__first != (uint64_t *)0x0 && uVar15 - 1 < 0xff) {
      psVar12 = &this->plain_username;
      pcVar13 = (char *)(this->plain_username)._M_string_length;
LAB_0017cf5b:
      std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar13,(ulong)__first);
      this->mechanism = 1;
      this->as_server = 0;
      return 0;
    }
    break;
  case 0x2e:
    if (__first == (uint64_t *)0x0 && uVar15 == 0) goto LAB_0017ce69;
    if (__first != (uint64_t *)0x0 && uVar15 - 1 < 0xff) {
      psVar12 = &this->plain_password;
      pcVar13 = (char *)(this->plain_password)._M_string_length;
      goto LAB_0017cf5b;
    }
    break;
  case 0x36:
    out_value_ = &this->conflate;
LAB_0017ce43:
    iVar5 = do_setsockopt_int_as_bool_strict(__first,uVar15,out_value_);
    return iVar5;
  case 0x37:
    iVar5 = do_setsockopt_string_allow_empty_relaxed(__first,uVar15,&this->zap_domain,sVar11);
    return iVar5;
  case 0x39:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->tos = uVar10;
      return 0;
    }
    break;
  case 0x3a:
    iVar5 = do_setsockopt_set<int>(__first,uVar15,&this->ipc_pid_accept_filters);
    return iVar5;
  case 0x3b:
    set_ = &this->ipc_uid_accept_filters;
    goto LAB_0017cead;
  case 0x3c:
    set_ = &this->ipc_gid_accept_filters;
LAB_0017cead:
    iVar5 = do_setsockopt_set<unsigned_int>(__first,uVar15,set_);
    return iVar5;
  case 0x42:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->handshake_ivl = uVar10;
      return 0;
    }
    break;
  case 0x44:
    psVar12 = &this->socks_proxy_address;
    sVar11 = 0xffffffffffffffff;
    goto LAB_0017cf20;
  case 0x4a:
    if (uVar15 == 4) {
      this->invert_matching = (uint)*__first != 0;
      return 0;
    }
    break;
  case 0x4b:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->heartbeat_interval = uVar10;
      return 0;
    }
    break;
  case 0x4c:
    if (uVar10 + 99 < 0x640063 && uVar15 == 4) {
      this->heartbeat_ttl =
           (short)(uint)((ulong)((long)(int)uVar10 * 0x51eb851f) >> 0x25) -
           ((short)(sVar11 >> 0x10) >> 0xf);
      return 0;
    }
    break;
  case 0x4d:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->heartbeat_timeout = uVar10;
      return 0;
    }
    break;
  case 0x4f:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->connect_timeout = uVar10;
      return 0;
    }
    break;
  case 0x50:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->tcp_maxrt = uVar10;
      return 0;
    }
    break;
  case 0x54:
    if (0 < (int)uVar10 && uVar15 == 4) {
      this->multicast_maxtpdu = uVar10;
      return 0;
    }
    break;
  case 0x59:
    if (-2 < (int)uVar10 && uVar15 == 4) {
      this->use_fd = uVar10;
      return 0;
    }
    break;
  case 0x5c:
    psVar12 = &this->bound_device;
    sVar11 = 0x10;
    goto LAB_0017cf20;
  case 0x5d:
    if (uVar15 == 4) {
      this->zap_enforce_domain = (uint)*__first != 0;
      return 0;
    }
    break;
  case 0x5e:
    if (uVar15 == 4) {
      this->loopback_fastpath = (uint)*__first != 0;
      return 0;
    }
    break;
  case 0x5f:
    if ((uVar15 & 0xfffffffffffffffb) == 0) break;
    puVar3 = (undefined1 *)((long)&local_b8 + 0x10);
    local_b8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,__first,uVar15 + (long)__first);
    lVar8 = std::__cxx11::string::find((char)&local_b8,0x3a);
    if ((lVar8 - 1U < 0xfffffffffffffffe) && (lVar8 != (long)local_b8.ipv4.sin_zero + -1)) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_b8);
      iVar5 = std::__cxx11::string::compare((ulong)&local_58,0,(char *)0x2);
      if ((iVar5 == 0) && (local_58._M_string_length < 0x100)) {
        std::__cxx11::string::substr((ulong)&local_38,(ulong)&local_b8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_98,&local_58,&local_38);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&this->app_metadata,&local_98);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_b8._0_8_ == puVar3) {
          return 0;
        }
        uVar15 = local_b8._16_8_ + 1;
        uVar16 = local_b8._0_8_;
        goto LAB_0017cfb7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_b8._0_8_ != puVar3) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    break;
  case 0x60:
    if (uVar15 == 4) {
      this->multicast_loop = (uint)*__first != 0;
      return 0;
    }
    break;
  case 99:
    if (__first == (uint64_t *)0x0 || uVar15 == 0) {
      (this->socks_proxy_username)._M_string_length = 0;
      pcVar7 = (this->socks_proxy_username)._M_dataplus._M_p;
LAB_0017cb08:
      *pcVar7 = '\0';
      return 0;
    }
    psVar12 = &this->socks_proxy_username;
    goto LAB_0017cf12;
  case 100:
    if (__first == (uint64_t *)0x0 || uVar15 == 0) {
      (this->socks_proxy_password)._M_string_length = 0;
      pcVar7 = (this->socks_proxy_password)._M_dataplus._M_p;
      goto LAB_0017cb08;
    }
    psVar12 = &this->socks_proxy_password;
LAB_0017cf12:
    sVar11 = 0xff;
LAB_0017cf20:
    iVar5 = do_setsockopt_string_allow_empty_strict(__first,uVar15,psVar12,sVar11);
    return iVar5;
  case 0x65:
    if (0 < (int)uVar10 && uVar15 == 4) {
      this->in_batch_size = uVar10;
      return 0;
    }
    break;
  case 0x66:
    if (0 < (int)uVar10 && uVar15 == 4) {
      this->out_batch_size = uVar10;
      return 0;
    }
    break;
  case 0x6d:
    if (uVar15 == 4) {
      this->reconnect_stop = uVar10;
      return 0;
    }
    break;
  case 0x6e:
    if (uVar15 == 0) {
      pvVar14 = &this->hello_msg;
LAB_0017cf88:
      local_98.first._M_dataplus._M_p = (pointer)0x0;
      local_98.first._M_string_length = 0;
      local_98.first.field_2._M_allocated_capacity = 0;
    }
    else {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)__first,
                 (uchar *)(uVar15 + (long)__first),(allocator_type *)&local_b8);
      pvVar14 = &this->hello_msg;
    }
    goto LAB_0017cf9c;
  case 0x6f:
    if (uVar15 == 0) {
      pvVar14 = &this->disconnect_msg;
      goto LAB_0017cf88;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,(uchar *)__first,
               (uchar *)(uVar15 + (long)__first),(allocator_type *)&local_b8);
    pvVar14 = &this->disconnect_msg;
LAB_0017cf9c:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar14,&local_98);
    if (local_98.first._M_dataplus._M_p == (pointer)0x0) {
      return 0;
    }
    uVar15 = local_98.first.field_2._M_allocated_capacity - (long)local_98.first._M_dataplus._M_p;
    uVar16 = local_98.first._M_dataplus._M_p;
LAB_0017cfb7:
    operator_delete((void *)uVar16,uVar15);
    return 0;
  case 0x70:
    if (-1 < (int)uVar10 && uVar15 == 4) {
      this->priority = uVar10;
      return 0;
    }
  }
  piVar9 = __errno_location();
  *piVar9 = 0x16;
  return -1;
}

Assistant:

int zmq::options_t::setsockopt (int option_,
                                const void *optval_,
                                size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));
#if defined(ZMQ_ACT_MILITANT)
    bool malformed = true; //  Did caller pass a bad option value?
#endif

    switch (option_) {
        case ZMQ_SNDHWM:
            if (is_int && value >= 0) {
                sndhwm = value;
                return 0;
            }
            break;

        case ZMQ_RCVHWM:
            if (is_int && value >= 0) {
                rcvhwm = value;
                return 0;
            }
            break;

        case ZMQ_AFFINITY:
            return do_setsockopt (optval_, optvallen_, &affinity);

        case ZMQ_ROUTING_ID:
            //  Routing id is any binary string from 1 to 255 octets
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX) {
                routing_id_size = static_cast<unsigned char> (optvallen_);
                memcpy (routing_id, optval_, routing_id_size);
                return 0;
            }
            break;

        case ZMQ_RATE:
            if (is_int && value > 0) {
                rate = value;
                return 0;
            }
            break;

        case ZMQ_RECOVERY_IVL:
            if (is_int && value >= 0) {
                recovery_ivl = value;
                return 0;
            }
            break;

        case ZMQ_SNDBUF:
            if (is_int && value >= -1) {
                sndbuf = value;
                return 0;
            }
            break;

        case ZMQ_RCVBUF:
            if (is_int && value >= -1) {
                rcvbuf = value;
                return 0;
            }
            break;

        case ZMQ_TOS:
            if (is_int && value >= 0) {
                tos = value;
                return 0;
            }
            break;

        case ZMQ_LINGER:
            if (is_int && value >= -1) {
                linger.store (value);
                return 0;
            }
            break;

        case ZMQ_CONNECT_TIMEOUT:
            if (is_int && value >= 0) {
                connect_timeout = value;
                return 0;
            }
            break;

        case ZMQ_TCP_MAXRT:
            if (is_int && value >= 0) {
                tcp_maxrt = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_STOP:
            if (is_int) {
                reconnect_stop = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL:
            if (is_int && value >= -1) {
                reconnect_ivl = value;
                return 0;
            }
            break;

        case ZMQ_RECONNECT_IVL_MAX:
            if (is_int && value >= 0) {
                reconnect_ivl_max = value;
                return 0;
            }
            break;

        case ZMQ_BACKLOG:
            if (is_int && value >= 0) {
                backlog = value;
                return 0;
            }
            break;

        case ZMQ_MAXMSGSIZE:
            return do_setsockopt (optval_, optvallen_, &maxmsgsize);

        case ZMQ_MULTICAST_HOPS:
            if (is_int && value > 0) {
                multicast_hops = value;
                return 0;
            }
            break;

        case ZMQ_MULTICAST_MAXTPDU:
            if (is_int && value > 0) {
                multicast_maxtpdu = value;
                return 0;
            }
            break;

        case ZMQ_RCVTIMEO:
            if (is_int && value >= -1) {
                rcvtimeo = value;
                return 0;
            }
            break;

        case ZMQ_SNDTIMEO:
            if (is_int && value >= -1) {
                sndtimeo = value;
                return 0;
            }
            break;

        /*  Deprecated in favor of ZMQ_IPV6  */
        case ZMQ_IPV4ONLY: {
            bool value;
            const int rc =
              do_setsockopt_int_as_bool_strict (optval_, optvallen_, &value);
            if (rc == 0)
                ipv6 = !value;
            return rc;
        }

        /*  To replace the somewhat surprising IPV4ONLY */
        case ZMQ_IPV6:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &ipv6);

        case ZMQ_SOCKS_PROXY:
            return do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &socks_proxy_address, SIZE_MAX);

        case ZMQ_SOCKS_USERNAME:
            /* Make empty string or NULL equivalent. */
            if (optval_ == NULL || optvallen_ == 0) {
                socks_proxy_username.clear ();
                return 0;
            } else {
                return do_setsockopt_string_allow_empty_strict (
                  optval_, optvallen_, &socks_proxy_username, 255);
            }
        case ZMQ_SOCKS_PASSWORD:
            /* Make empty string or NULL equivalent. */
            if (optval_ == NULL || optvallen_ == 0) {
                socks_proxy_password.clear ();
                return 0;
            } else {
                return do_setsockopt_string_allow_empty_strict (
                  optval_, optvallen_, &socks_proxy_password, 255);
            }
        case ZMQ_TCP_KEEPALIVE:
            if (is_int && (value == -1 || value == 0 || value == 1)) {
                tcp_keepalive = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_CNT:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_cnt = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_IDLE:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_idle = value;
                return 0;
            }
            break;

        case ZMQ_TCP_KEEPALIVE_INTVL:
            if (is_int && (value == -1 || value >= 0)) {
                tcp_keepalive_intvl = value;
                return 0;
            }
            break;

        case ZMQ_IMMEDIATE:
            // TODO why is immediate not bool (and called non_immediate, as its meaning appears to be reversed)
            if (is_int && (value == 0 || value == 1)) {
                immediate = value;
                return 0;
            }
            break;

        case ZMQ_TCP_ACCEPT_FILTER: {
            std::string filter_str;
            int rc = do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &filter_str, UCHAR_MAX);
            if (rc == 0) {
                if (filter_str.empty ()) {
                    tcp_accept_filters.clear ();
                } else {
                    tcp_address_mask_t mask;
                    rc = mask.resolve (filter_str.c_str (), ipv6);
                    if (rc == 0) {
                        tcp_accept_filters.push_back (mask);
                    }
                }
            }
            return rc;
        }

#if defined ZMQ_HAVE_SO_PEERCRED || defined ZMQ_HAVE_LOCAL_PEERCRED
        case ZMQ_IPC_FILTER_UID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_uid_accept_filters);


        case ZMQ_IPC_FILTER_GID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_gid_accept_filters);
#endif

#if defined ZMQ_HAVE_SO_PEERCRED
        case ZMQ_IPC_FILTER_PID:
            return do_setsockopt_set (optval_, optvallen_,
                                      &ipc_pid_accept_filters);
#endif

        case ZMQ_PLAIN_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = value ? ZMQ_PLAIN : ZMQ_NULL;
                return 0;
            }
            break;

        case ZMQ_PLAIN_USERNAME:
            if (optvallen_ == 0 && optval_ == NULL) {
                mechanism = ZMQ_NULL;
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX
                       && optval_ != NULL) {
                plain_username.assign (static_cast<const char *> (optval_),
                                       optvallen_);
                as_server = 0;
                mechanism = ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_PLAIN_PASSWORD:
            if (optvallen_ == 0 && optval_ == NULL) {
                mechanism = ZMQ_NULL;
                return 0;
            } else if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX
                       && optval_ != NULL) {
                plain_password.assign (static_cast<const char *> (optval_),
                                       optvallen_);
                as_server = 0;
                mechanism = ZMQ_PLAIN;
                return 0;
            }
            break;

        case ZMQ_ZAP_DOMAIN:
            return do_setsockopt_string_allow_empty_relaxed (
              optval_, optvallen_, &zap_domain, UCHAR_MAX);

            //  If curve encryption isn't built, these options provoke EINVAL
#ifdef ZMQ_HAVE_CURVE
        case ZMQ_CURVE_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = value ? ZMQ_CURVE : ZMQ_NULL;
                return 0;
            }
            break;

        case ZMQ_CURVE_PUBLICKEY:
            if (0 == set_curve_key (curve_public_key, optval_, optvallen_)) {
                return 0;
            }
            break;

        case ZMQ_CURVE_SECRETKEY:
            if (0 == set_curve_key (curve_secret_key, optval_, optvallen_)) {
                return 0;
            }
            break;

        case ZMQ_CURVE_SERVERKEY:
            if (0 == set_curve_key (curve_server_key, optval_, optvallen_)) {
                as_server = 0;
                return 0;
            }
            break;
#endif

        case ZMQ_CONFLATE:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &conflate);

            //  If libgssapi isn't installed, these options provoke EINVAL
#ifdef HAVE_LIBGSSAPI_KRB5
        case ZMQ_GSSAPI_SERVER:
            if (is_int && (value == 0 || value == 1)) {
                as_server = value;
                mechanism = ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PRINCIPAL:
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX && optval_ != NULL) {
                gss_principal.assign ((const char *) optval_, optvallen_);
                mechanism = ZMQ_GSSAPI;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL:
            if (optvallen_ > 0 && optvallen_ <= UCHAR_MAX && optval_ != NULL) {
                gss_service_principal.assign ((const char *) optval_,
                                              optvallen_);
                mechanism = ZMQ_GSSAPI;
                as_server = 0;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_PLAINTEXT:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &gss_plaintext);

        case ZMQ_GSSAPI_PRINCIPAL_NAMETYPE:
            if (is_int
                && (value == ZMQ_GSSAPI_NT_HOSTBASED
                    || value == ZMQ_GSSAPI_NT_USER_NAME
                    || value == ZMQ_GSSAPI_NT_KRB5_PRINCIPAL)) {
                gss_principal_nt = value;
                return 0;
            }
            break;

        case ZMQ_GSSAPI_SERVICE_PRINCIPAL_NAMETYPE:
            if (is_int
                && (value == ZMQ_GSSAPI_NT_HOSTBASED
                    || value == ZMQ_GSSAPI_NT_USER_NAME
                    || value == ZMQ_GSSAPI_NT_KRB5_PRINCIPAL)) {
                gss_service_principal_nt = value;
                return 0;
            }
            break;
#endif

        case ZMQ_HANDSHAKE_IVL:
            if (is_int && value >= 0) {
                handshake_ivl = value;
                return 0;
            }
            break;

        case ZMQ_INVERT_MATCHING:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &invert_matching);

        case ZMQ_HEARTBEAT_IVL:
            if (is_int && value >= 0) {
                heartbeat_interval = value;
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TTL:
            // Convert this to deciseconds from milliseconds
            value = value / deciseconds_per_millisecond;
            if (is_int && value >= 0 && value <= UINT16_MAX) {
                heartbeat_ttl = static_cast<uint16_t> (value);
                return 0;
            }
            break;

        case ZMQ_HEARTBEAT_TIMEOUT:
            if (is_int && value >= 0) {
                heartbeat_timeout = value;
                return 0;
            }
            break;

#ifdef ZMQ_HAVE_VMCI
        case ZMQ_VMCI_BUFFER_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_size);

        case ZMQ_VMCI_BUFFER_MIN_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_min_size);

        case ZMQ_VMCI_BUFFER_MAX_SIZE:
            return do_setsockopt (optval_, optvallen_, &vmci_buffer_max_size);

        case ZMQ_VMCI_CONNECT_TIMEOUT:
            return do_setsockopt (optval_, optvallen_, &vmci_connect_timeout);
#endif

        case ZMQ_USE_FD:
            if (is_int && value >= -1) {
                use_fd = value;
                return 0;
            }
            break;

        case ZMQ_BINDTODEVICE:
            return do_setsockopt_string_allow_empty_strict (
              optval_, optvallen_, &bound_device, BINDDEVSIZ);

        case ZMQ_ZAP_ENFORCE_DOMAIN:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &zap_enforce_domain);

        case ZMQ_LOOPBACK_FASTPATH:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &loopback_fastpath);

        case ZMQ_METADATA:
            if (optvallen_ > 0 && !is_int) {
                const std::string s (static_cast<const char *> (optval_),
                                     optvallen_);
                const size_t pos = s.find (':');
                if (pos != std::string::npos && pos != 0
                    && pos != s.length () - 1) {
                    const std::string key = s.substr (0, pos);
                    if (key.compare (0, 2, "X-") == 0
                        && key.length () <= UCHAR_MAX) {
                        std::string val = s.substr (pos + 1, s.length ());
                        app_metadata.insert (
                          std::pair<std::string, std::string> (key, val));
                        return 0;
                    }
                }
            }
            errno = EINVAL;
            return -1;

        case ZMQ_MULTICAST_LOOP:
            return do_setsockopt_int_as_bool_relaxed (optval_, optvallen_,
                                                      &multicast_loop);

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_IN_BATCH_SIZE:
            if (is_int && value > 0) {
                in_batch_size = value;
                return 0;
            }
            break;

        case ZMQ_OUT_BATCH_SIZE:
            if (is_int && value > 0) {
                out_batch_size = value;
                return 0;
            }
            break;

#ifdef ZMQ_HAVE_WSS
        case ZMQ_WSS_KEY_PEM:
            // TODO: check if valid certificate
            wss_key_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_CERT_PEM:
            // TODO: check if valid certificate
            wss_cert_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_TRUST_PEM:
            // TODO: check if valid certificate
            wss_trust_pem = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_HOSTNAME:
            wss_hostname = std::string ((char *) optval_, optvallen_);
            return 0;
        case ZMQ_WSS_TRUST_SYSTEM:
            return do_setsockopt_int_as_bool_strict (optval_, optvallen_,
                                                     &wss_trust_system);
#endif

        case ZMQ_HELLO_MSG:
            if (optvallen_ > 0) {
                unsigned char *bytes = (unsigned char *) optval_;
                hello_msg =
                  std::vector<unsigned char> (bytes, bytes + optvallen_);
            } else {
                hello_msg = std::vector<unsigned char> ();
            }

            return 0;

        case ZMQ_DISCONNECT_MSG:
            if (optvallen_ > 0) {
                unsigned char *bytes = (unsigned char *) optval_;
                disconnect_msg =
                  std::vector<unsigned char> (bytes, bytes + optvallen_);
            } else {
                disconnect_msg = std::vector<unsigned char> ();
            }

            return 0;

        case ZMQ_PRIORITY:
            if (is_int && value >= 0) {
                priority = value;
                return 0;
            }
            break;

#endif

        default:
#if defined(ZMQ_ACT_MILITANT)
            //  There are valid scenarios for probing with unknown socket option
            //  values, e.g. to check if security is enabled or not. This will not
            //  provoke a militant assert. However, passing bad values to a valid
            //  socket option will, if ZMQ_ACT_MILITANT is defined.
            malformed = false;
#endif
            break;
    }

        // TODO mechanism should either be set explicitly, or determined when
        // connecting. currently, it depends on the order of setsockopt calls
        // if there is some inconsistency, which is confusing. in addition,
        // the assumed or set mechanism should be queryable (as a socket option)

#if defined(ZMQ_ACT_MILITANT)
    //  There is no valid use case for passing an error back to the application
    //  when it sent malformed arguments to a socket option. Use ./configure
    //  --with-militant to enable this checking.
    if (malformed)
        zmq_assert (false);
#endif
    errno = EINVAL;
    return -1;
}